

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_blocker(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict portorfd,
            sexp_conflict timeout)

{
  undefined1 auVar1 [16];
  int iVar2;
  sexp_conflict psVar3;
  sexp_conflict in_RCX;
  sexp_conflict in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_conflict in_R8;
  int fd;
  long local_48;
  long in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  if (((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x10)) ||
     ((((ulong)in_RCX & 3) == 0 && (in_RCX->tag == 0x11)))) {
    if ((in_RCX->value).type.getters == (sexp)0x0) {
      if ((((in_RCX->value).string.length & 3) == 0) && (((in_RCX->value).type.slots)->tag == 0x12))
      {
        local_48 = (((in_RCX->value).type.slots)->value).fileno.fd;
      }
      else {
        local_48 = -1;
      }
    }
    else {
      iVar2 = fileno((FILE *)(in_RCX->value).type.getters);
      local_48 = (long)iVar2;
    }
    iVar2 = (int)local_48;
  }
  else {
    local_48 = in_stack_ffffffffffffffc0;
    if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x12)) {
      iVar2 = (int)(in_RCX->value).fileno.fd;
    }
    else {
      if (((ulong)in_RCX & 1) != 1) {
        psVar3 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x10,in_RCX);
        return psVar3;
      }
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
      iVar2 = SUB164(auVar1 / SEXT816(2),0);
    }
  }
  if (-1 < iVar2) {
    sexp_insert_pollfd((sexp_conflict)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                       (int)((ulong)local_48 >> 0x20),(int)local_48);
  }
  *(undefined1 *)(in_RDI + 0x60ab) = 1;
  *(sexp_conflict *)(in_RDI + 0x58) = in_RCX;
  sexp_insert_timed(in_RDX,in_RCX,in_R8);
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_blocker (sexp ctx, sexp self, sexp_sint_t n, sexp portorfd, sexp timeout) {
  int fd;
  /* register the fd */
  if (sexp_portp(portorfd))
    fd = sexp_port_fileno(portorfd);
  else if (sexp_filenop(portorfd))
    fd = sexp_fileno_fd(portorfd);
  else if (sexp_fixnump(portorfd))
    fd = sexp_unbox_fixnum(portorfd);
  else
    return sexp_type_exception(ctx, self, SEXP_IPORT, portorfd);
  if (fd >= 0)
    sexp_insert_pollfd(ctx, fd, sexp_oportp(portorfd) ? POLLOUT : POLLIN);
  /* pause the current thread */
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = portorfd;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_VOID;
}